

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  ushort uVar1;
  ValueHolder VVar2;
  Value temp;
  ValueHolder local_28;
  ushort local_20;
  
  Value((Value *)&local_28,other);
  uVar1 = *(ushort *)&this->field_0x8;
  *(ushort *)&this->field_0x8 = uVar1 & 0xff00 | local_20 & 0xff;
  VVar2 = this->value_;
  this->value_ = local_28;
  *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | local_20 & 0xff | local_20 & 0x100;
  local_20 = local_20 & 0xfe00 | uVar1 & 0xff | uVar1 & 0x100;
  local_28 = VVar2;
  ~Value((Value *)&local_28);
  return this;
}

Assistant:

Value &
Value::operator=( const Value &other )
{
   Value temp( other );
   swap( temp );
   return *this;
}